

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

void Am_Copy_Values_To_Command(Am_Object *from_object)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Value *local_88;
  Am_Value *local_70;
  Am_Value *local_58;
  undefined1 local_28 [8];
  Am_Value value;
  Am_Object command;
  Am_Object *from_object_local;
  
  bVar1 = Am_Object::Valid(from_object);
  if (bVar1) {
    Am_Object::Get_Object((Am_Object *)&value.value,(Am_Slot_Key)from_object,0xc5);
    Am_Value::Am_Value((Am_Value *)local_28);
    pAVar2 = Am_Object::Peek(from_object,0x169,0);
    Am_Value::operator=((Am_Value *)local_28,pAVar2);
    bVar1 = Am_Value::Exists((Am_Value *)local_28);
    if (bVar1) {
      local_58 = (Am_Value *)local_28;
    }
    else {
      local_58 = &Am_No_Value;
    }
    Am_Object::Set((Am_Object *)&value.value,0x169,local_58,1);
    pAVar2 = Am_Object::Peek(from_object,0x16d,0);
    Am_Value::operator=((Am_Value *)local_28,pAVar2);
    bVar1 = Am_Value::Exists((Am_Value *)local_28);
    if (bVar1) {
      local_70 = (Am_Value *)local_28;
    }
    else {
      local_70 = &Am_No_Value;
    }
    Am_Object::Set((Am_Object *)&value.value,0x16d,local_70,1);
    pAVar2 = Am_Object::Peek(from_object,0x16c,0);
    Am_Value::operator=((Am_Value *)local_28,pAVar2);
    bVar1 = Am_Value::Exists((Am_Value *)local_28);
    if (bVar1) {
      local_88 = (Am_Value *)local_28;
    }
    else {
      local_88 = &Am_No_Value;
    }
    Am_Object::Set((Am_Object *)&value.value,0x16c,local_88,1);
    Am_Value::~Am_Value((Am_Value *)local_28);
    Am_Object::~Am_Object((Am_Object *)&value.value);
  }
  return;
}

Assistant:

void
Am_Copy_Values_To_Command(Am_Object from_object)
{
  if (from_object.Valid()) {
    Am_Object command = from_object.Get_Object(Am_COMMAND);
    Am_Value value;
    value = from_object.Peek(Am_VALUE);
    command.Set(Am_VALUE, value.Exists() ? value : Am_No_Value,
                Am_OK_IF_NOT_THERE);
    value = from_object.Peek(Am_OBJECT_MODIFIED);
    command.Set(Am_OBJECT_MODIFIED, value.Exists() ? value : Am_No_Value,
                Am_OK_IF_NOT_THERE);
    value = from_object.Peek(Am_OLD_VALUE);
    command.Set(Am_OLD_VALUE, value.Exists() ? value : Am_No_Value,
                Am_OK_IF_NOT_THERE);
  }
}